

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Function *f)

{
  pointer ppVar1;
  pool_ref<soul::AST::VariableDeclaration> *v;
  pointer ppVar2;
  
  if ((f->returnType).object == (Expression *)0x0) {
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  (*this->_vptr_ASTVisitor[3])();
  ppVar1 = (f->parameters).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (f->parameters).
                super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    (*this->_vptr_ASTVisitor[4])(this,ppVar2->object);
  }
  if ((f->block).object != (Block *)0x0) {
    (*this->_vptr_ASTVisitor[4])(this);
    return;
  }
  return;
}

Assistant:

virtual void visit (AST::Function& f)
    {
        visitObject (*f.returnType);

        for (auto& v : f.parameters)
            visitObject (v);

        visitObjectIfNotNull (f.block);
    }